

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::setCurrency(DecimalFormat *this,char16_t *theCurrency,UErrorCode *ec)

{
  DecimalFormatProperties *pDVar1;
  UBool UVar2;
  UErrorCode localStatus;
  CurrencyUnit currencyUnit;
  ConstChar16Ptr local_78;
  char16_t *local_70;
  CurrencyUnit local_60;
  CurrencyUnit local_40;
  
  local_78.p_ = theCurrency;
  CurrencyUnit::CurrencyUnit(&local_40,&local_78,ec);
  local_70 = local_78.p_;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    if ((pDVar1->currency).fNull == false) {
      CurrencyUnit::CurrencyUnit(&local_60,&(pDVar1->currency).fValue);
      UVar2 = MeasureUnit::operator==(&local_60.super_MeasureUnit,(UObject *)&local_40);
      CurrencyUnit::~CurrencyUnit(&local_60);
      if (UVar2 != '\0') goto LAB_002da10c;
    }
    NumberFormat::setCurrency(&this->super_NumberFormat,theCurrency,ec);
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    CurrencyUnit::operator=(&(pDVar1->currency).fValue,&local_40);
    (pDVar1->currency).fNull = false;
    local_60.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = 0;
    touch(this,(UErrorCode *)&local_60);
  }
LAB_002da10c:
  CurrencyUnit::~CurrencyUnit(&local_40);
  return;
}

Assistant:

void DecimalFormat::setCurrency(const char16_t* theCurrency, UErrorCode& ec) {
    CurrencyUnit currencyUnit(theCurrency, ec);
    if (U_FAILURE(ec)) { return; }
    if (!fields->properties->currency.isNull() && fields->properties->currency.getNoError() == currencyUnit) {
        return;
    }
    NumberFormat::setCurrency(theCurrency, ec); // to set field for compatibility
    fields->properties->currency = currencyUnit;
    // TODO: Set values in fields->symbols, too?
    touchNoError();
}